

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O0

void __thiscall
burst::k_ary_search_set<int,std::less<void>>::initialize<boost::iterator_range<int_const*>>
          (k_ary_search_set<int,std::less<void>> *this,iterator_range<const_int_*> *range)

{
  int *piVar1;
  int *piVar2;
  iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_b8;
  int *local_a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  const_iterator local_98;
  int *local_88;
  int *local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  const_iterator local_70;
  int *local_60;
  int *local_58;
  allocator<int> local_39;
  undefined1 local_38 [8];
  value_container_type buffer;
  bool is_sorted_and_unique;
  iterator_range<const_int_*> *range_local;
  k_ary_search_set<int,_std::less<void>_> *this_local;
  
  piVar1 = boost::iterator_range_detail::
           iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::begin
                     ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                       *)range);
  piVar2 = boost::iterator_range_detail::
           iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::end
                     ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                       *)range);
  not_fn<std::less<void>&>((less<void> *)(this + 0x20));
  piVar1 = std::adjacent_find<int_const*,burst::not_fn_t<std::less<void>>>(piVar1,piVar2);
  piVar2 = boost::iterator_range_detail::
           iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::end
                     ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                       *)range);
  buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = piVar1 == piVar2;
  if ((bool)buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._7_1_) {
    initialize_trusted<boost::iterator_range<int_const*>>(this,range);
  }
  else {
    piVar1 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::begin
                       ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                         *)range);
    piVar2 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::end
                       ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                         *)range);
    std::allocator<int>::allocator(&local_39);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)local_38,piVar1,piVar2,&local_39);
    std::allocator<int>::~allocator(&local_39);
    local_58 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)local_38);
    local_60 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)local_38);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<void>>
              (local_58,local_60);
    local_80 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)local_38);
    local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)local_38);
    not_fn<std::less<void>&>((less<void> *)(this + 0x20));
    local_78 = std::
               unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::not_fn_t<std::less<void>>>
                         (local_80,local_88);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_70,
               &local_78);
    local_a0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_38);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_98,
               &local_a0);
    local_a8 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                ((vector<int,_std::allocator<int>_> *)local_38,local_70,local_98);
    local_b8 = (iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                )boost::make_iterator_range<std::vector<int,std::allocator<int>>>
                           ((vector<int,_std::allocator<int>_> *)local_38);
    initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
              (this,(iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                     *)&local_b8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  }
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }